

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

t_int * threshold_tilde_perform(t_int *w)

{
  long lVar1;
  int local_24;
  int n;
  t_threshold_tilde *x;
  t_sample *in1;
  t_int *w_local;
  
  x = (t_threshold_tilde *)w[1];
  lVar1 = w[2];
  local_24 = (int)w[3];
  if (*(float *)(lVar1 + 0x58) <= 0.0) {
    if (*(int *)(lVar1 + 0x4c) == 0) {
      while (local_24 != 0) {
        if (*(float *)(lVar1 + 0x50) <= *(float *)&(x->x_obj).te_g.g_pd) {
          clock_delay(*(_clock **)(lVar1 + 0x40),0.0);
          *(undefined4 *)(lVar1 + 0x4c) = 1;
          *(undefined4 *)(lVar1 + 0x58) = *(undefined4 *)(lVar1 + 0x60);
          break;
        }
        x = (t_threshold_tilde *)((long)&(x->x_obj).te_g.g_pd + 4);
        local_24 = local_24 + -1;
      }
    }
    else {
      while (local_24 != 0) {
        if (*(float *)&(x->x_obj).te_g.g_pd < *(float *)(lVar1 + 0x54)) {
          clock_delay(*(_clock **)(lVar1 + 0x40),0.0);
          *(undefined4 *)(lVar1 + 0x4c) = 0;
          *(undefined4 *)(lVar1 + 0x58) = *(undefined4 *)(lVar1 + 100);
          break;
        }
        x = (t_threshold_tilde *)((long)&(x->x_obj).te_g.g_pd + 4);
        local_24 = local_24 + -1;
      }
    }
  }
  else {
    *(float *)(lVar1 + 0x58) = *(float *)(lVar1 + 0x58) - *(float *)(lVar1 + 0x5c);
  }
  return w + 4;
}

Assistant:

static t_int *threshold_tilde_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_threshold_tilde *x = (t_threshold_tilde *)(w[2]);
    int n = (int)w[3];
    if (x->x_deadwait > 0)
        x->x_deadwait -= x->x_msecpertick;
    else if (x->x_state)
    {
            /* we're high; look for low sample */
        for (; n--; in1++)
        {
            if (*in1 < x->x_lothresh)
            {
                clock_delay(x->x_clock, 0L);
                x->x_state = 0;
                x->x_deadwait = x->x_lodeadtime;
                goto done;
            }
        }
    }
    else
    {
            /* we're low; look for high sample */
        for (; n--; in1++)
        {
            if (*in1 >= x->x_hithresh)
            {
                clock_delay(x->x_clock, 0L);
                x->x_state = 1;
                x->x_deadwait = x->x_hideadtime;
                goto done;
            }
        }
    }
done:
    return (w+4);
}